

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O3

bool __thiscall common::Config::GetHost(Config *this,string *group,int index,Host *host)

{
  pointer __s2;
  size_t __n;
  int iVar1;
  pointer psVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  psVar2 = (this->m_hosts).
           super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = 0;
  lVar3 = (long)(this->m_hosts).
                super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2;
  if (lVar3 == 0) {
    bVar7 = false;
  }
  else {
    uVar4 = lVar3 >> 4;
    __s2 = (group->_M_dataplus)._M_p;
    __n = group->_M_string_length;
    bVar7 = true;
    uVar5 = 1;
    do {
      lVar3 = (long)(psVar2->super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((*(size_t *)(lVar3 + 0xa8) == __n) &&
         ((__n == 0 || (iVar1 = bcmp(*(void **)(lVar3 + 0xa0),__s2,__n), iVar1 == 0)))) {
        if (iVar6 == index) {
          std::__cxx11::string::_M_assign((string *)host);
          std::__cxx11::string::_M_assign((string *)&host->user);
          std::__cxx11::string::_M_assign((string *)&host->password);
          std::__cxx11::string::_M_assign((string *)&host->ip);
          host->port = *(uint16_t *)(lVar3 + 0x80);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&host->tags,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(lVar3 + 0x88));
          std::__cxx11::string::_M_assign((string *)&host->group);
          return bVar7;
        }
        iVar6 = iVar6 + 1;
      }
      bVar7 = uVar5 < uVar4;
      lVar3 = (-(ulong)(uVar4 == 0) - uVar4) + uVar5;
      uVar5 = uVar5 + 1;
      psVar2 = psVar2 + 1;
    } while (lVar3 != 0);
  }
  return bVar7;
}

Assistant:

bool Config::GetHost(const std::string& group, int index, Host* host) {
    int num = 0;
    for (size_t i = 0; i < m_hosts.size(); i++) {
        if (m_hosts[i]->group == group) {
            if (num == index) {
                *host = *m_hosts[i];
                return true;
            }
            num++;
        }
    }
    return false;
}